

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::GetRethrowLabel(TypeChecker *this,Index depth,Label **out_label)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  undefined8 uVar5;
  string local_78;
  LabelType local_58;
  uint local_54;
  LabelType type;
  Index idx;
  string candidates;
  Label **out_label_local;
  Index depth_local;
  TypeChecker *this_local;
  
  candidates.field_2._12_4_ = GetLabel(this,depth,out_label);
  bVar1 = Failed((Result)candidates.field_2._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if ((*out_label)->label_type == Catch) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::__cxx11::string::string((string *)&type);
    local_54 = 0;
    while( true ) {
      uVar4 = (ulong)local_54;
      sVar2 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                        (&this->label_stack_);
      if (sVar2 <= uVar4) break;
      sVar2 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                        (&this->label_stack_);
      pvVar3 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::
               operator[](&this->label_stack_,(sVar2 - local_54) - 1);
      local_58 = pvVar3->label_type;
      if (local_58 == Catch) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::append((char *)&type);
        }
        std::__cxx11::to_string(&local_78,local_54);
        std::__cxx11::string::append((string *)&type);
        std::__cxx11::string::~string((string *)&local_78);
      }
      local_54 = local_54 + 1;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      uVar5 = std::__cxx11::string::c_str();
      PrintError(this,"invalid rethrow depth: %u (catches: %s)",(ulong)depth,uVar5);
    }
    else {
      PrintError(this,"rethrow not in try catch block");
    }
    *out_label = (Label *)0x0;
    Result::Result((Result *)((long)&this_local + 4),Error);
    std::__cxx11::string::~string((string *)&type);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::GetRethrowLabel(Index depth, Label** out_label) {
  if (Failed(GetLabel(depth, out_label))) {
    return Result::Error;
  }

  if ((*out_label)->label_type == LabelType::Catch) {
    return Result::Ok;
  }

  std::string candidates;
  for (Index idx = 0; idx < label_stack_.size(); idx++) {
    LabelType type = label_stack_[label_stack_.size() - idx - 1].label_type;
    if (type == LabelType::Catch) {
      if (!candidates.empty()) {
        candidates.append(", ");
      }
      candidates.append(std::to_string(idx));
    }
  }

  if (candidates.empty()) {
    PrintError("rethrow not in try catch block");
  } else {
    PrintError("invalid rethrow depth: %" PRIindex " (catches: %s)", depth,
               candidates.c_str());
  }
  *out_label = nullptr;
  return Result::Error;
}